

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall Js::ByteCodeWriter::End(ByteCodeWriter *this)

{
  Data *this_00;
  uint *puVar1;
  uint byteCount;
  ulong uVar2;
  uchar *puVar3;
  FunctionProxy *pFVar4;
  code *pcVar5;
  ByteBlock *pBVar6;
  bool bVar7;
  uint32 uVar8;
  uint uVar9;
  undefined4 *puVar10;
  ScriptContext *pSVar11;
  byte *byteBuffer;
  Type *pTVar12;
  long lVar13;
  ByteBlock *pBVar14;
  List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *jumpOffset;
  ulong uVar15;
  ByteBlock *local_58;
  ByteBlock *finalByteCodeBlock;
  ByteBlock *finalAuxiliaryContextBlock;
  ByteBlock *local_40;
  ByteBlock *finalAuxiliaryBlock;
  
  if (this->isInUse == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x87,"(isInUse)","isInUse");
    if (!bVar7) goto LAB_0088bc17;
    *puVar10 = 0;
  }
  CheckOpen(this);
  Empty(this,EndOfBlock);
  local_58 = (ByteBlock *)0x0;
  pSVar11 = FunctionProxy::GetScriptContext((FunctionProxy *)this->m_functionWrite);
  Data::Copy(&this->m_byteCodeData,pSVar11->recycler,&local_58);
  byteBuffer = ByteBlock::GetBuffer(local_58);
  byteCount = (this->m_byteCodeData).currentOffset;
  jumpOffset = this->m_jumpOffsets;
  if (this->useBranchIsland == true) {
    PatchJumpOffset<short>(this,jumpOffset,byteBuffer,byteCount);
    jumpOffset = this->m_longJumpOffsets;
  }
  PatchJumpOffset<int>(this,jumpOffset,byteBuffer,byteCount);
  uVar8 = FunctionBody::GetCountField(this->m_functionWrite,RootObjectLoadInlineCacheStart);
  pBVar14 = (ByteBlock *)&this->rootObjectLoadInlineCacheOffsets;
  finalAuxiliaryContextBlock = (ByteBlock *)this;
  local_40 = pBVar14;
  finalAuxiliaryBlock = pBVar14;
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  uVar15 = (ulong)byteCount - 4;
  while( true ) {
    if (pBVar14 == (ByteBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar7) goto LAB_0088bc17;
      *puVar10 = 0;
      pBVar14 = finalAuxiliaryBlock;
    }
    pBVar6 = finalAuxiliaryContextBlock;
    if (*(ByteBlock **)pBVar14 == local_40) break;
    finalAuxiliaryBlock = *(ByteBlock **)pBVar14;
    pTVar12 = SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&stack0xffffffffffffffc0);
    uVar2 = *pTVar12;
    if (uVar15 <= uVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0xa9,"(offset < byteCount - sizeof(int))",
                                  "offset < byteCount - sizeof(int)");
      if (!bVar7) goto LAB_0088bc17;
      *puVar10 = 0;
    }
    *(uint32 *)(byteBuffer + uVar2) = *(int *)(byteBuffer + uVar2) + uVar8;
    pBVar14 = finalAuxiliaryBlock;
  }
  uVar8 = FunctionBody::GetCountField
                    ((FunctionBody *)finalAuxiliaryContextBlock[6].m_content.ptr,
                     RootObjectLoadMethodInlineCacheStart);
  local_40 = (ByteBlock *)&pBVar6[5].m_content;
  finalAuxiliaryBlock = local_40;
  while( true ) {
    if (finalAuxiliaryBlock == (ByteBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar7) goto LAB_0088bc17;
      *puVar10 = 0;
    }
    pBVar14 = finalAuxiliaryContextBlock;
    if (*(ByteBlock **)finalAuxiliaryBlock == local_40) break;
    finalAuxiliaryBlock = *(ByteBlock **)finalAuxiliaryBlock;
    pTVar12 = SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&stack0xffffffffffffffc0);
    uVar2 = *pTVar12;
    if (uVar15 <= uVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0xb2,"(offset < byteCount - sizeof(int))",
                                  "offset < byteCount - sizeof(int)");
      if (!bVar7) goto LAB_0088bc17;
      *puVar10 = 0;
    }
    *(uint32 *)(byteBuffer + uVar2) = *(int *)(byteBuffer + uVar2) + uVar8;
  }
  uVar8 = FunctionBody::GetCountField
                    ((FunctionBody *)finalAuxiliaryContextBlock[6].m_content.ptr,
                     RootObjectStoreInlineCacheStart);
  local_40 = (ByteBlock *)&pBVar14[4].m_content;
  finalAuxiliaryBlock = local_40;
  while( true ) {
    if (finalAuxiliaryBlock == (ByteBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar7) goto LAB_0088bc17;
      *puVar10 = 0;
    }
    pBVar14 = finalAuxiliaryContextBlock;
    if (*(ByteBlock **)finalAuxiliaryBlock == local_40) break;
    finalAuxiliaryBlock = *(ByteBlock **)finalAuxiliaryBlock;
    pTVar12 = SListBase<unsigned_long,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&stack0xffffffffffffffc0);
    uVar2 = *pTVar12;
    if (uVar15 <= uVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0xbb,"(offset < byteCount - sizeof(int))",
                                  "offset < byteCount - sizeof(int)");
      if (!bVar7) goto LAB_0088bc17;
      *puVar10 = 0;
    }
    *(uint32 *)(byteBuffer + uVar2) = *(int *)(byteBuffer + uVar2) + uVar8;
  }
  local_40 = (ByteBlock *)0x0;
  finalByteCodeBlock = (ByteBlock *)0x0;
  this_00 = (Data *)(finalAuxiliaryContextBlock + 9);
  pSVar11 = FunctionProxy::GetScriptContext
                      ((FunctionProxy *)finalAuxiliaryContextBlock[6].m_content.ptr);
  Data::Copy(this_00,pSVar11->recycler,&stack0xffffffffffffffc0);
  pSVar11 = FunctionProxy::GetScriptContext((FunctionProxy *)pBVar14[6].m_content.ptr);
  Data::Copy((Data *)(pBVar14 + 0xb),pSVar11->recycler,&finalByteCodeBlock);
  FunctionBody::AllocateInlineCache((FunctionBody *)pBVar14[6].m_content.ptr);
  FunctionBody::AllocateObjectLiteralTypeArray((FunctionBody *)pBVar14[6].m_content.ptr);
  FunctionBody::AllocateForInCache((FunctionBody *)pBVar14[6].m_content.ptr);
  uVar9 = FunctionProxy::GetSourceContextId((FunctionProxy *)pBVar14[6].m_content.ptr);
  puVar3 = pBVar14[6].m_content.ptr;
  lVar13 = *(long *)(puVar3 + 0x10);
  if (lVar13 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar7) goto LAB_0088bc17;
    *puVar10 = 0;
    lVar13 = *(long *)(puVar3 + 0x10);
  }
  bVar7 = Phases::IsEnabled((Phases *)&DAT_015a4e90,ScriptFunctionWithInlineCachePhase,uVar9,
                            *(LocalFunctionId *)(lVar13 + 0x10));
  if (!bVar7) {
    uVar9 = FunctionProxy::GetSourceContextId((FunctionProxy *)pBVar14[6].m_content.ptr);
    puVar3 = pBVar14[6].m_content.ptr;
    lVar13 = *(long *)(puVar3 + 0x10);
    if (lVar13 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar7) goto LAB_0088bc17;
      *puVar10 = 0;
      lVar13 = *(long *)(puVar3 + 0x10);
    }
    bVar7 = Phases::IsEnabled((Phases *)&DAT_015a4e90,InlineApplyTargetPhase,uVar9,
                              *(LocalFunctionId *)(lVar13 + 0x10));
    if (!bVar7) {
      bVar7 = FunctionBody::CanFunctionObjectHaveInlineCaches
                        ((FunctionBody *)pBVar14[6].m_content.ptr);
      if (bVar7) {
        puVar1 = (uint *)(pBVar14[6].m_content.ptr + 0x178);
        *puVar1 = *puVar1 | 0x80000;
      }
    }
  }
  if (pBVar14[0x11].field_0x4 == '\x01') {
    bVar7 = HasLoopWithoutYield((ByteCodeWriter *)pBVar14);
    if (!bVar7) goto LAB_0088bbc5;
    pFVar4 = (FunctionProxy *)pBVar14[6].m_content.ptr;
    bVar7 = FunctionProxy::IsFunctionBody(pFVar4);
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar7) goto LAB_0088bc17;
      *puVar10 = 0;
    }
    if (((ulong)pFVar4[1].super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject & 4) != 0) {
      uVar9 = FunctionProxy::GetSourceContextId((FunctionProxy *)pBVar14[6].m_content.ptr);
      puVar3 = pBVar14[6].m_content.ptr;
      lVar13 = *(long *)(puVar3 + 0x10);
      if (lVar13 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar7) goto LAB_0088bc17;
        *puVar10 = 0;
        lVar13 = *(long *)(puVar3 + 0x10);
      }
      bVar7 = Phases::IsEnabled((Phases *)&DAT_015a4e90,JITLoopBodyInTryCatchPhase,uVar9,
                                *(LocalFunctionId *)(lVar13 + 0x10));
      if (bVar7) goto LAB_0088bbc5;
    }
    pFVar4 = (FunctionProxy *)pBVar14[6].m_content.ptr;
    bVar7 = FunctionProxy::IsFunctionBody(pFVar4);
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar7) goto LAB_0088bc17;
      *puVar10 = 0;
    }
    if (*(char *)((long)&pFVar4[5].super_FinalizableObject.super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject + 7) == '\x01') {
      uVar9 = FunctionProxy::GetSourceContextId((FunctionProxy *)pBVar14[6].m_content.ptr);
      puVar3 = pBVar14[6].m_content.ptr;
      lVar13 = *(long *)(puVar3 + 0x10);
      if (lVar13 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar7) {
LAB_0088bc17:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar10 = 0;
        lVar13 = *(long *)(puVar3 + 0x10);
      }
      bVar7 = Phases::IsEnabled((Phases *)&DAT_015a4e90,JITLoopBodyInTryFinallyPhase,uVar9,
                                *(LocalFunctionId *)(lVar13 + 0x10));
      if (bVar7) goto LAB_0088bbc5;
    }
    AllocateLoopHeaders((ByteCodeWriter *)pBVar14);
  }
LAB_0088bbc5:
  FunctionBody::MarkScript
            ((FunctionBody *)pBVar14[6].m_content.ptr,local_58,local_40,finalByteCodeBlock,
             *(uint *)&pBVar14[0x10].field_0x4,*(uint *)((long)&pBVar14[0x10].m_content.ptr + 4),
             *(uint *)&pBVar14[0x10].m_content.ptr);
  FunctionBody::LoadDynamicProfileInfo((FunctionBody *)pBVar14[6].m_content.ptr);
  Reset((ByteCodeWriter *)pBVar14);
  return;
}

Assistant:

void ByteCodeWriter::End()
#endif
    {
        Assert(isInUse);

        CheckOpen();
        Empty(OpCode::EndOfBlock);

        ByteBlock* finalByteCodeBlock = nullptr;

        ScriptContext* scriptContext = m_functionWrite->GetScriptContext();
        m_byteCodeData.Copy(scriptContext->GetRecycler(), &finalByteCodeBlock);

        byte * byteBuffer = finalByteCodeBlock->GetBuffer();
        uint byteCount = m_byteCodeData.GetCurrentOffset();

        //
        // Update all branch targets with their actual label destinations.
        //
#ifdef BYTECODE_BRANCH_ISLAND
        if (useBranchIsland)
        {
            PatchJumpOffset<JumpOffset>(m_jumpOffsets, byteBuffer, byteCount);
            PatchJumpOffset<LongJumpOffset>(m_longJumpOffsets, byteBuffer, byteCount);
        }
        else
        {
            PatchJumpOffset<LongJumpOffset>(m_jumpOffsets, byteBuffer, byteCount);
        }
#else
        PatchJumpOffset<JumpOffset>(m_jumpOffsets, byteBuffer, byteCount);
#endif

        // Patch up the root object load inline cache with the start index
        uint rootObjectLoadInlineCacheStart = this->m_functionWrite->GetRootObjectLoadInlineCacheStart();
        rootObjectLoadInlineCacheOffsets.Map([=](size_t offset)
        {
            Assert(offset < byteCount - sizeof(int));
            unaligned uint * pnBackPatch = reinterpret_cast<unaligned uint *>(&byteBuffer[offset]);
            *pnBackPatch += rootObjectLoadInlineCacheStart;
        });

        // Patch up the root object load method inline cache with the start index
        uint rootObjectLoadMethodInlineCacheStart = this->m_functionWrite->GetRootObjectLoadMethodInlineCacheStart();
        rootObjectLoadMethodInlineCacheOffsets.Map([=](size_t offset)
        {
            Assert(offset < byteCount - sizeof(int));
            unaligned uint * pnBackPatch = reinterpret_cast<unaligned uint *>(&byteBuffer[offset]);
            *pnBackPatch += rootObjectLoadMethodInlineCacheStart;
        });

        // Patch up the root object store inline cache with the start index
        uint rootObjectStoreInlineCacheStart = this->m_functionWrite->GetRootObjectStoreInlineCacheStart();
        rootObjectStoreInlineCacheOffsets.Map([=](size_t offset)
        {
            Assert(offset < byteCount - sizeof(int));
            unaligned uint * pnBackPatch = reinterpret_cast<unaligned uint *>(&byteBuffer[offset]);
            *pnBackPatch += rootObjectStoreInlineCacheStart;
        });

        //
        // Store the final trimmed byte-code on the function.
        //
        ByteBlock* finalAuxiliaryBlock = nullptr;
        ByteBlock* finalAuxiliaryContextBlock = nullptr;

        m_auxiliaryData.Copy(m_functionWrite->GetScriptContext()->GetRecycler(), &finalAuxiliaryBlock);
        m_auxContextData.Copy(m_functionWrite->GetScriptContext()->GetRecycler(), &finalAuxiliaryContextBlock);

        m_functionWrite->AllocateInlineCache();
        m_functionWrite->AllocateObjectLiteralTypeArray();
        m_functionWrite->AllocateForInCache();

        if (!PHASE_OFF(Js::ScriptFunctionWithInlineCachePhase, m_functionWrite) && !PHASE_OFF(Js::InlineApplyTargetPhase, m_functionWrite))
        {
            if (m_functionWrite->CanFunctionObjectHaveInlineCaches())
            {
                m_functionWrite->SetInlineCachesOnFunctionObject(true);
            }
        }

        if (this->DoJitLoopBodies() && this->HasLoopWithoutYield() &&
            !(this->m_functionWrite->GetFunctionBody()->GetHasTry() && PHASE_OFF(Js::JITLoopBodyInTryCatchPhase, this->m_functionWrite)) &&
            !(this->m_functionWrite->GetFunctionBody()->GetHasFinally() && PHASE_OFF(Js::JITLoopBodyInTryFinallyPhase, this->m_functionWrite)))
        {
            AllocateLoopHeaders();
        }

        m_functionWrite->MarkScript(finalByteCodeBlock, finalAuxiliaryBlock, finalAuxiliaryContextBlock,
            m_byteCodeCount, m_byteCodeInLoopCount, m_byteCodeWithoutLDACount);

#if ENABLE_PROFILE_INFO
        m_functionWrite->LoadDynamicProfileInfo();
#endif

        JS_ETW(EventWriteJSCRIPT_BYTECODEGEN_METHOD(m_functionWrite->GetHostSourceContext(), m_functionWrite->GetScriptContext(), m_functionWrite->GetLocalFunctionId(), m_functionWrite->GetByteCodeCount(), this->GetTotalSize(), m_functionWrite->GetExternalDisplayName()));

#ifdef LOG_BYTECODE_AST_RATIO
        // log the bytecode AST ratio
        if (currentAstSize == maxAstSize)
        {
            float astBytecodeRatio = (float)currentAstSize / (float)byteCount;
            Output::Print(_u("\tAST Bytecode ratio: %f\n"), astBytecodeRatio);
        }
#endif

        // TODO: add validation for source mapping under #dbg
        //
        // Reset the writer to prepare for the next user.
        //

        Reset();
    }